

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

void __thiscall
Js::HeapArgumentsObject::ExtractSnapObjectDataInto_Helper<(TTD::NSSnapObjects::SnapObjectType)13>
          (HeapArgumentsObject *this,SnapObject *objData,SlabAllocator *alloc)

{
  ActivationObject *v;
  bool bVar1;
  BOOLEAN BVar2;
  SnapHeapArgumentsInfo *addtlInfo;
  byte *pbVar3;
  uint32 i;
  ulong uVar4;
  TTD_PTR_ID *local_40;
  
  addtlInfo = (SnapHeapArgumentsInfo *)
              TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  if ((int)*(uint32 *)&this->field_0x20 < 0) {
    TTDAbort_unrecoverable_error("This never seems to be set but I want to assert just to be safe.")
    ;
  }
  addtlInfo->NumOfArguments = *(uint32 *)&this->field_0x20;
  addtlInfo->FormalCount = this->formalCount;
  addtlInfo->IsFrameNullPtr = false;
  addtlInfo->FrameObject = 0;
  v = (this->frameObject).ptr;
  if (v == (ActivationObject *)0x0) {
    addtlInfo->IsFrameNullPtr = true;
  }
  else {
    addtlInfo->FrameObject = (TTD_PTR_ID)v;
    bVar1 = TTD::JsSupport::IsVarComplexKind(v);
    if (bVar1) {
      local_40 = (TTD_PTR_ID *)TTD::SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(alloc,8);
      *local_40 = addtlInfo->FrameObject;
      bVar1 = false;
      goto LAB_009f9424;
    }
  }
  bVar1 = true;
  local_40 = (TTD_PTR_ID *)0x0;
LAB_009f9424:
  if (this->formalCount == 0) {
    pbVar3 = (byte *)0x0;
  }
  else {
    pbVar3 = TTD::SlabAllocatorBase<0>::SlabAllocateArrayZ<unsigned_char>
                       (alloc,(ulong)addtlInfo->FormalCount);
  }
  addtlInfo->DeletedArgFlags = pbVar3;
  if ((this->deletedArgs).ptr != (BVSparse<Memory::Recycler> *)0x0) {
    for (uVar4 = 0; uVar4 < this->formalCount; uVar4 = uVar4 + 1) {
      BVar2 = BVSparse<Memory::Recycler>::Test((this->deletedArgs).ptr,(BVIndex)uVar4);
      if (BVar2 != '\0') {
        addtlInfo->DeletedArgFlags[uVar4] = '\x01';
      }
    }
  }
  if (bVar1) {
    TTD::NSSnapObjects::
    SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
              (objData,addtlInfo);
    return;
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
            (objData,addtlInfo,alloc,1,local_40);
  return;
}

Assistant:

void HeapArgumentsObject::ExtractSnapObjectDataInto_Helper(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapHeapArgumentsInfo* argsInfo = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapHeapArgumentsInfo>();

        TTDAssert(this->callerDeleted == 0, "This never seems to be set but I want to assert just to be safe.");
        argsInfo->NumOfArguments = this->numOfArguments;
        argsInfo->FormalCount = this->formalCount;

        uint32 depOnCount = 0;
        TTD_PTR_ID* depOnArray = nullptr;

        argsInfo->IsFrameNullPtr = false;
        argsInfo->FrameObject = TTD_INVALID_PTR_ID;
        if(this->frameObject == nullptr)
        {
            argsInfo->IsFrameNullPtr = true;
        }
        else
        {
            argsInfo->FrameObject = TTD_CONVERT_VAR_TO_PTR_ID(this->frameObject);

            //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
            if(TTD::JsSupport::IsVarComplexKind(this->frameObject))
            {
                depOnCount = 1;
                depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);
                depOnArray[0] = argsInfo->FrameObject;
            }
        }

        argsInfo->DeletedArgFlags = (this->formalCount != 0) ? alloc.SlabAllocateArrayZ<byte>(argsInfo->FormalCount) : nullptr;
        if(this->deletedArgs != nullptr)
        {
            for(uint32 i = 0; i < this->formalCount; ++i)
            {
                if(this->deletedArgs->Test(i))
                {
                    argsInfo->DeletedArgFlags[i] = true;
                }
            }
        }

        if(depOnCount == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*, argsKind>(objData, argsInfo);
        }
        else
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*, argsKind>(objData, argsInfo, alloc, depOnCount, depOnArray);
        }
    }